

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlSBufAddString(xmlSBuf *buf,xmlChar *str,uint len)

{
  int iVar1;
  uint len_local;
  xmlChar *str_local;
  xmlSBuf *buf_local;
  
  if (buf->max - buf->size < len) {
    if (buf->code == XML_ERR_OK) {
      buf->code = XML_ERR_RESOURCE_LIMIT;
    }
  }
  else if ((len < buf->cap - buf->size) || (iVar1 = xmlSBufGrow(buf,len), -1 < iVar1)) {
    if (len != 0) {
      memcpy(buf->mem + buf->size,str,(ulong)len);
    }
    buf->size = len + buf->size;
  }
  return;
}

Assistant:

static void
xmlSBufAddString(xmlSBuf *buf, const xmlChar *str, unsigned len) {
    if (buf->max - buf->size < len) {
        if (buf->code == XML_ERR_OK)
            buf->code = XML_ERR_RESOURCE_LIMIT;
        return;
    }

    if (buf->cap - buf->size <= len) {
        if (xmlSBufGrow(buf, len) < 0)
            return;
    }

    if (len > 0)
        memcpy(buf->mem + buf->size, str, len);
    buf->size += len;
}